

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitReference(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  OpCode OVar1;
  Symbol *this;
  bool bVar2;
  RegSlot RVar3;
  ParseNodeBin *pPVar4;
  ParseNodeCall *pPVar5;
  ParseNodeName *pPVar6;
  Scope *this_00;
  FuncInfo *pFVar7;
  ParseNode *local_30;
  ParseNode *pnodeArg;
  Symbol *sym;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  OVar1 = pnode->nop;
  if (OVar1 == knopName) {
    return;
  }
  if (OVar1 != knopCall) {
    if (OVar1 == knopDot) {
      pPVar4 = ParseNode::AsParseNodeBin(pnode);
      Emit(pPVar4->pnode1,byteCodeGenerator,funcInfo,0,false,false);
      return;
    }
    if (OVar1 != knopNew) {
      if (OVar1 == knopIndex) {
        pPVar4 = ParseNode::AsParseNodeBin(pnode);
        Emit(pPVar4->pnode1,byteCodeGenerator,funcInfo,0,false,false);
        pPVar4 = ParseNode::AsParseNodeBin(pnode);
        Emit(pPVar4->pnode2,byteCodeGenerator,funcInfo,0,false,false);
        return;
      }
      if (OVar1 == knopObjectPattern) {
        return;
      }
      if (OVar1 == knopArrayPattern) {
        return;
      }
      Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
      return;
    }
  }
  pPVar5 = ParseNode::AsParseNodeCall(pnode);
  if (((byte)pPVar5->field_0x24 >> 3 & 1) != 0) goto LAB_00b46082;
  pPVar5 = ParseNode::AsParseNodeCall(pnode);
  OVar1 = pPVar5->pnodeTarget->nop;
  if (OVar1 != knopName) {
    if ((OVar1 == knopDot) || (OVar1 == knopIndex)) {
      pPVar5 = ParseNode::AsParseNodeCall(pnode);
      FuncInfo::AcquireLoc(funcInfo,pPVar5->pnodeTarget);
      pPVar5 = ParseNode::AsParseNodeCall(pnode);
      EmitReference(pPVar5->pnodeTarget,byteCodeGenerator,funcInfo);
    }
    else {
      pPVar5 = ParseNode::AsParseNodeCall(pnode);
      EmitLoad(pPVar5->pnodeTarget,byteCodeGenerator,funcInfo);
    }
    goto LAB_00b46082;
  }
  pPVar5 = ParseNode::AsParseNodeCall(pnode);
  pPVar6 = ParseNode::AsParseNodeName(pPVar5->pnodeTarget);
  this = pPVar6->sym;
  if ((this == (Symbol *)0x0) || (RVar3 = Symbol::GetLocation(this), RVar3 == 0xffffffff)) {
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::AcquireLoc(funcInfo,pPVar5->pnodeTarget);
  }
  if (this == (Symbol *)0x0) {
LAB_00b46027:
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    pPVar6 = ParseNode::AsParseNodeName(pPVar5->pnodeTarget);
    EmitUseBeforeDeclaration(pPVar6->sym,byteCodeGenerator,funcInfo);
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    EmitReference(pPVar5->pnodeTarget,byteCodeGenerator,funcInfo);
  }
  else {
    bVar2 = Symbol::IsInSlot(this,byteCodeGenerator,funcInfo,false);
    if (!bVar2) {
      this_00 = Symbol::GetScope(this);
      pFVar7 = Scope::GetFunc(this_00);
      if (pFVar7 == funcInfo) goto LAB_00b46027;
    }
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    EmitLoad(pPVar5->pnodeTarget,byteCodeGenerator,funcInfo);
  }
LAB_00b46082:
  pPVar5 = ParseNode::AsParseNodeCall(pnode);
  if (pPVar5->pnodeArgs != (ParseNodePtr)0x0) {
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    local_30 = pPVar5->pnodeArgs;
    while (local_30->nop == knopList) {
      pPVar4 = ParseNode::AsParseNodeBin(local_30);
      Emit(pPVar4->pnode1,byteCodeGenerator,funcInfo,0,false,false);
      pPVar4 = ParseNode::AsParseNodeBin(local_30);
      local_30 = pPVar4->pnode2;
    }
    Emit(local_30,byteCodeGenerator,funcInfo,0,false,false);
  }
  return;
}

Assistant:

void EmitReference(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    // Generate code for the LHS of an assignment.
    switch (pnode->nop)
    {
    case knopDot:
        Emit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
        break;

    case knopIndex:
        Emit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
        Emit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo, false);
        break;

    case knopName:
        break;

    case knopArrayPattern:
    case knopObjectPattern:
        break;

    case knopCall:
    case knopNew:
        // Emit the operands of a call that will be used as a LHS.
        // These have to be emitted before the RHS, but they have to persist until
        // the end of the expression.
        // Emit the call target operands first.
        // The call target does not need to be emitted for a super call - EmitSuperCall will do this.
        if (!pnode->AsParseNodeCall()->isSuperCall)
        {
            switch (pnode->AsParseNodeCall()->pnodeTarget->nop)
            {
            case knopDot:
            case knopIndex:
                funcInfo->AcquireLoc(pnode->AsParseNodeCall()->pnodeTarget);
                EmitReference(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo);
                break;

            case knopName:
            {
                Symbol* sym = pnode->AsParseNodeCall()->pnodeTarget->AsParseNodeName()->sym;
                if (!sym || sym->GetLocation() == Js::Constants::NoRegister)
                {
                    funcInfo->AcquireLoc(pnode->AsParseNodeCall()->pnodeTarget);
                }
                if (sym && (sym->IsInSlot(byteCodeGenerator, funcInfo) || sym->GetScope()->GetFunc() != funcInfo))
                {
                    // Can't get the value from the assigned register, so load it here.
                    EmitLoad(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo);
                }
                else
                {
                    // EmitLoad will check for needsDeclaration and emit the Use Before Declaration error
                    // bytecode op as necessary, but EmitReference does not check this (by design). So we
                    // must manually check here.
                    EmitUseBeforeDeclaration(pnode->AsParseNodeCall()->pnodeTarget->AsParseNodeName()->sym, byteCodeGenerator, funcInfo);
                    EmitReference(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo);
                }
                break;
            }
            default:
                EmitLoad(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo);
                break;
            }
        }

        // Now the arg list. We evaluate everything now and emit the ArgOut's later.
        if (pnode->AsParseNodeCall()->pnodeArgs)
        {
            ParseNode *pnodeArg = pnode->AsParseNodeCall()->pnodeArgs;
            while (pnodeArg->nop == knopList)
            {
                Emit(pnodeArg->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
                pnodeArg = pnodeArg->AsParseNodeBin()->pnode2;
            }
            Emit(pnodeArg, byteCodeGenerator, funcInfo, false);
        }
        break;

    default:
        Emit(pnode, byteCodeGenerator, funcInfo, false);
        break;
    }
}